

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O1

IShaderResourceVariable * __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetVariableByName
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType,
          char *Name)

{
  PIPELINE_TYPE PipelineType;
  char cVar1;
  SHADER_TYPE SVar2;
  bool bVar3;
  Int32 IVar4;
  uint uVar5;
  IShaderResourceVariable *pIVar6;
  char (*in_stack_ffffffffffffffa8) [3];
  char *Name_local;
  string _msg;
  char *local_28;
  Char *local_20;
  
  PipelineType = (((this->m_pPRS).m_pObject)->
                 super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_PipelineType;
  Name_local = Name;
  bVar3 = IsConsistentShaderType(ShaderType,PipelineType);
  if (bVar3) {
    IVar4 = GetShaderTypePipelineIndex(ShaderType,PipelineType);
    cVar1 = (this->m_ActiveShaderStageIndex)._M_elems[IVar4];
    if (-1 < cVar1) {
      SVar2 = (((this->m_pPRS).m_pObject)->
              super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_ShaderStages;
      uVar5 = SVar2 - (SVar2 >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f;
      if (uVar5 * 0x1010101 >> 0x18 <= (uint)(int)cVar1) {
        FormatString<char[26],char[46]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(MgrInd) < GetNumShaders()",
                   (char (*) [46])(ulong)uVar5);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"GetVariableByName",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                   ,0xc3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_msg._M_dataplus._M_p != &_msg.field_2) {
          operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
        }
      }
      pIVar6 = ShaderVariableManagerGL::GetVariable
                         (this->m_pShaderVarMgrs + (uint)(int)cVar1,Name_local);
      return pIVar6;
    }
  }
  else {
    local_20 = GetShaderTypeLiteralName(ShaderType);
    local_28 = GetPipelineTypeString(PipelineType);
    FormatString<char[42],char_const*,char[19],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              (&_msg,(Diligent *)"Unable to find mutable/dynamic variable \'",
               (char (*) [42])&Name_local,(char **)"\' in shader stage ",(char (*) [19])&local_20,
               (char **)" as the stage is invalid for ",(char (*) [30])&local_28,(char **)0x91bc39,
               (char (*) [31])
               &(((this->m_pPRS).m_pObject)->
                super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                .m_Desc,(char **)"\'.",in_stack_ffffffffffffffa8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_msg._M_dataplus._M_p != &_msg.field_2) {
      operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
    }
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

GetVariableByName(SHADER_TYPE ShaderType, const char* Name) override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        if (!IsConsistentShaderType(ShaderType, PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to find mutable/dynamic variable '", Name, "' in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(PipelineType), " pipeline resource signature '", m_pPRS->GetDesc().Name, "'.");
            return nullptr;
        }

        const Int32 ShaderInd = GetShaderTypePipelineIndex(ShaderType, PipelineType);
        const int   MgrInd    = m_ActiveShaderStageIndex[ShaderInd];
        if (MgrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(MgrInd) < GetNumShaders());
        return m_pShaderVarMgrs[MgrInd].GetVariable(Name);
    }